

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::StringMakerBase<true>::convert<std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,StringMakerBase<true> *this,
          basic_string_view<char,_std::char_traits<char>_> *_value)

{
  ostringstream local_190 [8];
  ostringstream oss;
  basic_string_view<char,_std::char_traits<char>_> *_value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_190,
                  *(basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }